

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

FT_Error cid_parse_font_matrix(CID_Face face,CID_Parser *parser)

{
  CID_FaceDict pCVar1;
  FT_Int FVar2;
  FT_Long FVar3;
  long lVar4;
  long b_;
  FT_Error FVar5;
  FT_Long local_58;
  FT_Fixed temp [6];
  
  lVar4 = (long)parser->num_dict;
  FVar5 = 0;
  if ((-1 < lVar4) && (FVar5 = 0, parser->num_dict < (face->cid).num_dicts)) {
    pCVar1 = (face->cid).font_dicts;
    FVar5 = 3;
    FVar2 = (*(parser->root).funcs.to_fixed_array)(&parser->root,6,&local_58,3);
    if (5 < FVar2) {
      b_ = -temp[2];
      if (0 < temp[2]) {
        b_ = temp[2];
      }
      if (temp[2] != 0) {
        if (b_ != 0x10000) {
          FVar3 = FT_DivFix(1000,b_);
          (face->root).units_per_EM = (FT_UShort)FVar3;
          local_58 = FT_DivFix(local_58,b_);
          temp[0] = FT_DivFix(temp[0],b_);
          temp[1] = FT_DivFix(temp[1],b_);
          temp[3] = FT_DivFix(temp[3],b_);
          temp[4] = FT_DivFix(temp[4],b_);
          temp[2] = (ulong)(-1 < temp[2]) * 0x20000 + -0x10000;
        }
        pCVar1[lVar4].font_matrix.xx = local_58;
        pCVar1[lVar4].font_matrix.yx = temp[0];
        pCVar1[lVar4].font_matrix.xy = temp[1];
        pCVar1[lVar4].font_matrix.yy = temp[2];
        pCVar1[lVar4].font_offset.x = temp[3] >> 0x10;
        pCVar1[lVar4].font_offset.y = temp[4] >> 0x10;
        FVar5 = 0;
      }
    }
  }
  return FVar5;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_parse_font_matrix( CID_Face     face,
                         CID_Parser*  parser )
  {
    CID_FaceDict  dict;
    FT_Face       root = (FT_Face)&face->root;
    FT_Fixed      temp[6];
    FT_Fixed      temp_scale;


    if ( parser->num_dict >= 0 && parser->num_dict < face->cid.num_dicts )
    {
      FT_Matrix*  matrix;
      FT_Vector*  offset;
      FT_Int      result;


      dict   = face->cid.font_dicts + parser->num_dict;
      matrix = &dict->font_matrix;
      offset = &dict->font_offset;

      /* input is scaled by 1000 to accommodate default FontMatrix */
      result = cid_parser_to_fixed_array( parser, 6, temp, 3 );

      if ( result < 6 )
        return FT_THROW( Invalid_File_Format );

      temp_scale = FT_ABS( temp[3] );

      if ( temp_scale == 0 )
      {
        FT_ERROR(( "cid_parse_font_matrix: invalid font matrix\n" ));
        return FT_THROW( Invalid_File_Format );
      }

      /* atypical case */
      if ( temp_scale != 0x10000L )
      {
        /* set units per EM based on FontMatrix values */
        root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

        temp[0] = FT_DivFix( temp[0], temp_scale );
        temp[1] = FT_DivFix( temp[1], temp_scale );
        temp[2] = FT_DivFix( temp[2], temp_scale );
        temp[4] = FT_DivFix( temp[4], temp_scale );
        temp[5] = FT_DivFix( temp[5], temp_scale );
        temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
      }

      matrix->xx = temp[0];
      matrix->yx = temp[1];
      matrix->xy = temp[2];
      matrix->yy = temp[3];

      /* note that the font offsets are expressed in integer font units */
      offset->x  = temp[4] >> 16;
      offset->y  = temp[5] >> 16;
    }

    return FT_Err_Ok;
  }